

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_qualifiers_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Variant *pVVar2;
  Bitset *pBVar3;
  ulong uVar4;
  SPIRVariable *pSVar5;
  SPIRType *pSVar6;
  runtime_error *this_00;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  pBVar3 = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)id);
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = (ulong)id;
  if ((uVar4 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar2[uVar4].type == TypeVariable)) {
    pSVar5 = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar4);
  }
  else {
    pSVar5 = (SPIRVariable *)0x0;
  }
  if ((pSVar5 != (SPIRVariable *)0x0) &&
     ((pSVar5->storage == StorageClassTaskPayloadWorkgroupEXT ||
      ((pSVar5->storage == StorageClassWorkgroup && ((this->backend).shared_is_implied == false)))))
     ) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x32])(&local_58,this,pBVar3);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
  ;
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (pSVar5 != (SPIRVariable *)0x0) {
    (*(this->super_Compiler)._vptr_Compiler[0x30])(this,pSVar5);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pSVar6 = Compiler::expression_type(&this->super_Compiler,id);
  if (((pSVar6->image).dim != DimSubpassData) && ((pSVar6->image).sampled == 2)) {
    if ((pBVar3->lower & 0x800000) != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((pBVar3->lower & 0x80000) != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((pBVar3->lower & 0x1000000) != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((pBVar3->lower & 0x2000000) == 0) {
      if ((pSVar6->image).format == ImageFormatUnknown) {
        local_58._M_dataplus._M_p = (pointer)paVar1;
        if ((this->options).es != false) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"Cannot use GL_EXT_shader_image_load_formatted in ESSL.",""
                    );
          ::std::runtime_error::runtime_error(this_00,(string *)&local_58);
          *(undefined ***)this_00 = &PTR__runtime_error_003d7e38;
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"GL_EXT_shader_image_load_formatted","");
        require_extension_internal(this,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p);
        }
      }
    }
    else {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  to_precision_qualifiers_glsl_abi_cxx11_(&local_58,this,id);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_qualifiers_glsl(uint32_t id)
{
	auto &flags = get_decoration_bitset(id);
	string res;

	auto *var = maybe_get<SPIRVariable>(id);

	if (var && var->storage == StorageClassWorkgroup && !backend.shared_is_implied)
		res += "shared ";
	else if (var && var->storage == StorageClassTaskPayloadWorkgroupEXT)
		res += "taskPayloadSharedEXT ";

	res += to_interpolation_qualifiers(flags);
	if (var)
		res += to_storage_qualifiers_glsl(*var);

	auto &type = expression_type(id);
	if (type.image.dim != DimSubpassData && type.image.sampled == 2)
	{
		if (flags.get(DecorationCoherent))
			res += "coherent ";
		if (flags.get(DecorationRestrict))
			res += "restrict ";

		if (flags.get(DecorationNonWritable))
			res += "readonly ";

		bool formatted_load = type.image.format == ImageFormatUnknown;
		if (flags.get(DecorationNonReadable))
		{
			res += "writeonly ";
			formatted_load = false;
		}

		if (formatted_load)
		{
			if (!options.es)
				require_extension_internal("GL_EXT_shader_image_load_formatted");
			else
				SPIRV_CROSS_THROW("Cannot use GL_EXT_shader_image_load_formatted in ESSL.");
		}
	}

	res += to_precision_qualifiers_glsl(id);

	return res;
}